

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

JSON __thiscall json::anon_unknown_1::parse_next(anon_unknown_1 *this,string *str,size_t *offset)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  JSON *pJVar4;
  ulong uVar5;
  long lVar6;
  runtime_error *prVar7;
  pointer pcVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  uint uVar11;
  byte bVar12;
  char cVar13;
  double dVar14;
  double dVar15;
  JSON JVar16;
  allocator local_e9;
  BackingData local_e8;
  string val;
  string exp_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  JSON Key;
  double local_58;
  JSON Value;
  
  local_e8 = (BackingData)this;
  consume_ws(str,offset);
  sVar9 = *offset;
  pcVar8 = (str->_M_dataplus)._M_p;
  cVar13 = pcVar8[sVar9];
  if (cVar13 == '\"') {
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    val._M_dataplus._M_p = (pointer)&val.field_2;
    while( true ) {
      *offset = sVar9 + 1;
      cVar13 = (char)&val;
      if (pcVar8[sVar9 + 1] != '\\') break;
      *offset = sVar9 + 2;
      switch(pcVar8[sVar9 + 2]) {
      case 'n':
        break;
      case 'o':
      case 'p':
      case 'q':
      case 's':
        break;
      case 'r':
        break;
      case 't':
        break;
      case 'u':
        std::__cxx11::string::append((char *)&val);
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          bVar12 = (str->_M_dataplus)._M_p[lVar6 + 1 + *offset];
          if ((9 < (byte)(bVar12 - 0x30)) &&
             ((0x25 < bVar12 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar12 - 0x41) & 0x3f) & 1) == 0)
              ))) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&Key,
                       "JSON ERROR: String: Expected hex character in unicode escape, found \'",
                       (allocator *)&Value);
            std::operator+(&local_a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Key
                           ,bVar12);
            std::operator+(&exp_str,&local_a0,"\'");
            std::runtime_error::runtime_error(prVar7,(string *)&exp_str);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::push_back(cVar13);
        }
        sVar9 = *offset + 4;
        *offset = sVar9;
        goto LAB_001dea06;
      default:
      }
switchD_001dea4a_caseD_6f:
      std::__cxx11::string::push_back(cVar13);
      sVar9 = *offset;
LAB_001dea06:
      pcVar8 = (str->_M_dataplus)._M_p;
    }
    if (pcVar8[sVar9 + 1] != '\"') goto switchD_001dea4a_caseD_6f;
    *offset = sVar9 + 2;
    std::__cxx11::string::string((string *)&exp_str,(string *)&val);
    JSON::JSON<std::__cxx11::string>((JSON *)local_e8.List,&exp_str,(type *)0x0);
LAB_001ded5e:
    std::__cxx11::string::~string((string *)&exp_str);
    std::__cxx11::string::~string((string *)&val);
    uVar10 = extraout_RDX_06;
    goto LAB_001ded72;
  }
  if (cVar13 == '{') {
    JSON::JSON((JSON *)local_e8.List,Object);
    *offset = *offset + 1;
    consume_ws(str,offset);
    uVar5 = *offset;
    uVar10 = extraout_RDX_03;
    if ((str->_M_dataplus)._M_p[uVar5] != '}') {
      while (uVar5 < str->_M_string_length) {
        parse_next((anon_unknown_1 *)&Key,str,offset);
        consume_ws(str,offset);
        if ((str->_M_dataplus)._M_p[*offset] != ':') {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_a0,"JSON ERROR: Object: Expected colon, found \'",
                     (allocator *)&Value);
          std::operator+(&exp_str,&local_a0,(str->_M_dataplus)._M_p[*offset]);
          std::operator+(&val,&exp_str,"\'\n");
          std::runtime_error::runtime_error(prVar7,(string *)&val);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *offset = *offset + 1;
        consume_ws(str,offset);
        parse_next((anon_unknown_1 *)&Value,str,offset);
        JSON::ToString_abi_cxx11_(&val,&Key);
        pJVar4 = JSON::operator[]((JSON *)local_e8.List,&val);
        JSON::operator=(pJVar4,&Value);
        std::__cxx11::string::~string((string *)&val);
        consume_ws(str,offset);
        sVar9 = *offset;
        cVar13 = (str->_M_dataplus)._M_p[sVar9];
        if (cVar13 != ',') {
          if (cVar13 != '}') {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_a0,"JSON ERROR: Object: Expected comma, found \'",&local_e9)
            ;
            std::operator+(&exp_str,&local_a0,(str->_M_dataplus)._M_p[*offset]);
            std::operator+(&val,&exp_str,"\'\n");
            std::runtime_error::runtime_error(prVar7,(string *)&val);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          *offset = sVar9 + 1;
          JSON::~JSON(&Value);
          JSON::~JSON(&Key);
          uVar10 = extraout_RDX_05;
          break;
        }
        *offset = sVar9 + 1;
        JSON::~JSON(&Value);
        JSON::~JSON(&Key);
        uVar10 = extraout_RDX_04;
        uVar5 = *offset;
      }
      goto LAB_001ded72;
    }
LAB_001dec18:
    *offset = uVar5 + 1;
  }
  else {
    if (cVar13 != 'f') {
      if (cVar13 == 'n') {
        std::__cxx11::string::substr((ulong)&val,(ulong)str);
        bVar1 = std::operator!=(&val,"null");
        std::__cxx11::string::~string((string *)&val);
        if (bVar1) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_a0,"JSON ERROR: Null: Expected \'null\', found \'",
                     (allocator *)&Value);
          std::__cxx11::string::substr((ulong)&Key,(ulong)str);
          std::operator+(&exp_str,&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Key);
          std::operator+(&val,&exp_str,"\'");
          std::runtime_error::runtime_error(prVar7,(string *)&val);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *offset = *offset + 4;
        ((local_e8.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        *(undefined4 *)
         &((local_e8.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.
          super__Deque_impl_data._M_map_size = 0;
        uVar10 = extraout_RDX_02;
        goto LAB_001ded72;
      }
      if (cVar13 != 't') {
        if (cVar13 != '[') {
          if (cVar13 != '-' && 9 < (byte)(cVar13 - 0x30U)) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_a0,"JSON ERROR: Parse: Unexpected starting character \'",
                       (allocator *)&Key);
            std::operator+(&exp_str,&local_a0,cVar13);
            std::operator+(&val,&exp_str,"\'");
            std::runtime_error::runtime_error(prVar7,(string *)&val);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          ((local_e8.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          *(undefined4 *)
           &((local_e8.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.
            super__Deque_impl_data._M_map_size = 0;
          val._M_string_length = 0;
          bVar12 = 0;
          exp_str._M_dataplus._M_p = (pointer)&exp_str.field_2;
          exp_str._M_string_length = 0;
          val.field_2._M_local_buf[0] = '\0';
          exp_str.field_2._M_local_buf[0] = '\0';
          bVar1 = false;
          val._M_dataplus._M_p = (pointer)&val.field_2;
          while (uVar5 = str->_M_string_length, sVar9 < uVar5) {
            *offset = sVar9 + 1;
            bVar12 = (str->_M_dataplus)._M_p[sVar9];
            if (bVar12 == 0x2d || (byte)(bVar12 - 0x30) < 10) {
              std::__cxx11::string::push_back((char)&val);
            }
            else {
              if (bVar12 != 0x2e) {
                uVar5 = str->_M_string_length;
                sVar9 = sVar9 + 1;
                break;
              }
              bVar1 = true;
              std::__cxx11::string::push_back((char)&val);
            }
            sVar9 = *offset;
          }
          if ((sVar9 < uVar5) && ((bVar12 & 0xdf) == 0x45)) {
            *offset = sVar9 + 1;
            cVar13 = (str->_M_dataplus)._M_p[sVar9];
            if (cVar13 != '+') {
              if (cVar13 == '-') {
                std::__cxx11::string::push_back((char)&exp_str);
              }
              else {
                *offset = sVar9;
              }
            }
            while (uVar5 = *offset, uVar5 < str->_M_string_length) {
              *offset = uVar5 + 1;
              cVar13 = (str->_M_dataplus)._M_p[uVar5];
              if (9 < (byte)(cVar13 - 0x30U)) {
                iVar3 = isspace((int)cVar13);
                if ((((char)iVar3 == '\0') && (cVar13 != ',')) &&
                   ((cVar13 != ']' && (cVar13 != '}')))) {
                  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::string::string
                            ((string *)&Value,
                             "JSON ERROR: Number: Expected a number for exponent, found \'",
                             &local_e9);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&Key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&Value,cVar13);
                  std::operator+(&local_a0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&Key,"\'");
                  std::runtime_error::runtime_error(prVar7,(string *)&local_a0);
                  __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                break;
              }
              std::__cxx11::string::push_back((char)&exp_str);
            }
            lVar6 = std::__cxx11::stol(&exp_str,(size_t *)0x0,10);
            sVar9 = *offset;
            local_58 = (double)lVar6;
          }
          else {
            local_58 = 0.0;
            if (((sVar9 < uVar5) &&
                (((iVar3 = isspace((int)(char)bVar12), (char)iVar3 == '\0' && (bVar12 != 0x2c)) &&
                 (bVar12 != 0x5d)))) && (bVar12 != 0x7d)) {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string
                        ((string *)&Value,"JSON ERROR: Number: unexpected character \'",&local_e9);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &Key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&Value,bVar12);
              std::operator+(&local_a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &Key,"\'");
              std::runtime_error::runtime_error(prVar7,(string *)&local_a0);
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          *offset = sVar9 - 1;
          if (bVar1) {
            dVar14 = std::__cxx11::stod(&val,(size_t *)0x0);
            dVar15 = pow(10.0,local_58);
            dVar14 = dVar14 * dVar15;
          }
          else {
            if (exp_str._M_string_length == 0) {
              lVar6 = std::__cxx11::stol(&val,(size_t *)0x0,10);
              JSON::operator=((JSON *)local_e8.List,lVar6);
              goto LAB_001ded5e;
            }
            lVar6 = std::__cxx11::stol(&val,(size_t *)0x0,10);
            dVar14 = pow(10.0,local_58);
            dVar14 = dVar14 * (double)lVar6;
          }
          JSON::operator=((JSON *)local_e8.List,dVar14);
          goto LAB_001ded5e;
        }
        JSON::JSON((JSON *)local_e8.List,Array);
        *offset = *offset + 1;
        consume_ws(str,offset);
        uVar5 = *offset;
        uVar10 = extraout_RDX;
        if ((str->_M_dataplus)._M_p[uVar5] != ']') {
          uVar11 = 0;
          while (uVar5 < str->_M_string_length) {
            parse_next((anon_unknown_1 *)&val,str,offset);
            pJVar4 = JSON::operator[]((JSON *)local_e8.List,(ulong)uVar11);
            pJVar4->Internal = (BackingData)val._M_dataplus._M_p;
            pJVar4->Type = (Class)val._M_string_length;
            val._M_dataplus._M_p = (pointer)0x0;
            val._M_string_length = val._M_string_length & 0xffffffff00000000;
            JSON::~JSON((JSON *)&val);
            consume_ws(str,offset);
            uVar5 = *offset;
            cVar13 = (str->_M_dataplus)._M_p[uVar5];
            uVar10 = extraout_RDX_00;
            if (cVar13 != ',') {
              if (cVar13 != ']') {
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::string::string
                          ((string *)&local_a0,
                           "JSON ERROR: Array: Expected \',\' or \']\', found \'",(allocator *)&Key)
                ;
                std::operator+(&exp_str,&local_a0,(str->_M_dataplus)._M_p[*offset]);
                std::operator+(&val,&exp_str,"\'\n");
                std::runtime_error::runtime_error(prVar7,(string *)&val);
                __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              goto LAB_001dec18;
            }
            uVar5 = uVar5 + 1;
            *offset = uVar5;
            uVar11 = uVar11 + 1;
          }
          goto LAB_001ded72;
        }
        goto LAB_001dec18;
      }
    }
    ((local_e8.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    *(undefined4 *)
     &((local_e8.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.
      super__Deque_impl_data._M_map_size = 0;
    lVar6 = 4;
    std::__cxx11::string::substr((ulong)&val,(ulong)str);
    bVar1 = std::operator==(&val,"true");
    std::__cxx11::string::~string((string *)&val);
    if (!bVar1) {
      lVar6 = 5;
      std::__cxx11::string::substr((ulong)&val,(ulong)str);
      bVar2 = std::operator==(&val,"false");
      std::__cxx11::string::~string((string *)&val);
      if (!bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_a0,"JSON ERROR: Bool: Expected \'true\' or \'false\', found \'",
                   (allocator *)&Value);
        std::__cxx11::string::substr((ulong)&Key,(ulong)str);
        std::operator+(&exp_str,&local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Key);
        std::operator+(&val,&exp_str,"\'");
        std::runtime_error::runtime_error(prVar7,(string *)&val);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    *offset = *offset + lVar6;
    JSON::operator=((JSON *)local_e8.List,bVar1);
    uVar10 = extraout_RDX_01;
  }
LAB_001ded72:
  JVar16._8_8_ = uVar10;
  JVar16.Internal.List = local_e8.List;
  return JVar16;
}

Assistant:

JSON parse_next( const string &str, size_t &offset ) {
        char value;
        consume_ws( str, offset );
        value = str[offset];
        switch( value ) {
            case '[' : return parse_array( str, offset );
            case '{' : return parse_object( str, offset );
            case '\"': return parse_string( str, offset );
            case 't' :
            case 'f' : return parse_bool( str, offset );
            case 'n' : return parse_null( str, offset );
            default  : if( ( value <= '9' && value >= '0' ) || value == '-' )
                           return parse_number( str, offset );
        }
        throw std::runtime_error(std::string("JSON ERROR: Parse: Unexpected starting character '") + value + "'");
    }